

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageLabelDocumentHelper.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFPageLabelDocumentHelper::getLabelForPage(QPDFPageLabelDocumentHelper *this,longlong page_idx)

{
  bool bVar1;
  __shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00
  ;
  element_type *this_01;
  numtree_number in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle local_198;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  QPDFObjectHandle local_110;
  longlong local_100;
  longlong start;
  string local_f0 [32];
  undefined1 local_d0 [8];
  QPDFObjectHandle St;
  string local_b8 [32];
  undefined1 local_98 [8];
  QPDFObjectHandle P;
  string local_80 [32];
  undefined1 local_60 [8];
  QPDFObjectHandle S;
  undefined1 local_40 [8];
  QPDFObjectHandle label;
  numtree_number offset;
  longlong page_idx_local;
  QPDFPageLabelDocumentHelper *this_local;
  QPDFObjectHandle *result;
  
  QPDFObjectHandle::newNull();
  bVar1 = hasPageLabels((QPDFPageLabelDocumentHelper *)page_idx);
  _Var2._M_pi = extraout_RDX;
  if (bVar1) {
    label.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_40);
    this_00 = (__shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 __shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFPageLabelDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(page_idx + 0x10));
    this_01 = std::
              __shared_ptr_access<QPDFNumberTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->(this_00);
    bVar1 = QPDFNumberTreeObjectHelper::findObjectAtOrBelow
                      (this_01,in_RDX,(QPDFObjectHandle *)local_40,
                       (numtree_number *)
                       &label.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((bVar1) && (bVar1 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_40), bVar1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"/S",
                 (allocator<char> *)
                 ((long)&P.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_60,(string *)local_40);
      std::__cxx11::string::~string(local_80);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&P.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_b8,"/P",
                 (allocator<char> *)
                 ((long)&St.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_98,(string *)local_40);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&St.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi + 7));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f0,"/St",(allocator<char> *)((long)&start + 7));
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_d0,(string *)local_40);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
      local_100 = 1;
      bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)local_d0);
      if (bVar1) {
        local_100 = QPDFObjectHandle::getIntValue((QPDFObjectHandle *)local_d0);
      }
      QIntC::range_check<long_long>
                (&local_100,
                 (longlong *)
                 &label.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      local_100 = (long)&(label.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_vptr__Sp_counted_base + local_100;
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::operator=((QPDFObjectHandle *)this,&local_110);
      QPDFObjectHandle::~QPDFObjectHandle(&local_110);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"/S",&local_131);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_130,(QPDFObjectHandle *)local_60)
      ;
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"/P",&local_159);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_158,(QPDFObjectHandle *)local_98)
      ;
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"/St",&local_181);
      QPDFObjectHandle::newInteger(&local_198,local_100);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)this,&local_180,&local_198);
      QPDFObjectHandle::~QPDFObjectHandle(&local_198);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_d0);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_98);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_60);
    }
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_40);
    _Var2._M_pi = extraout_RDX_00;
  }
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageLabelDocumentHelper::getLabelForPage(long long page_idx)
{
    QPDFObjectHandle result(QPDFObjectHandle::newNull());
    if (!hasPageLabels()) {
        return result;
    }
    QPDFNumberTreeObjectHelper::numtree_number offset = 0;
    QPDFObjectHandle label;
    if (!m->labels->findObjectAtOrBelow(page_idx, label, offset)) {
        return result;
    }
    if (!label.isDictionary()) {
        return result;
    }
    QPDFObjectHandle S = label.getKey("/S");   // type (D, R, r, A, a)
    QPDFObjectHandle P = label.getKey("/P");   // prefix
    QPDFObjectHandle St = label.getKey("/St"); // starting number
    long long start = 1;
    if (St.isInteger()) {
        start = St.getIntValue();
    }
    QIntC::range_check(start, offset);
    start += offset;
    result = QPDFObjectHandle::newDictionary();
    result.replaceKey("/S", S);
    result.replaceKey("/P", P);
    result.replaceKey("/St", QPDFObjectHandle::newInteger(start));
    return result;
}